

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O1

long duckdb::ArrayNegativeInnerProductFun::GetFunctions(void)

{
  NotImplementedException *this;
  undefined8 *puVar1;
  long in_RDI;
  undefined8 *puVar2;
  optional_idx oVar3;
  long lVar4;
  byte bVar5;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  ScalarFunction function;
  LogicalType array;
  allocator_type local_579;
  code *local_578;
  undefined8 uStack_570;
  code *local_568;
  code *pcStack_560;
  long local_550;
  _Any_data *local_548;
  _Any_data *local_540;
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *local_538;
  undefined8 *local_530;
  code *local_528;
  LogicalType *local_520;
  LogicalType local_518 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_500;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  LogicalType *local_4d8;
  LogicalType *local_4d0;
  pointer local_4c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_4c0;
  LogicalType local_4a8 [24];
  undefined1 *local_490 [2];
  undefined1 local_480 [16];
  undefined1 local_470 [176];
  _Any_data local_3c0;
  _Manager_type local_3b0;
  undefined8 local_3a0 [9];
  element_type *local_358;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  LogicalType local_348 [24];
  undefined1 local_330 [176];
  undefined1 local_280 [176];
  _Any_data local_1d0;
  _Manager_type local_1c0;
  undefined8 auStack_1b0 [9];
  element_type *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  undefined1 local_158 [176];
  _Any_data _Stack_a8;
  _Manager_type local_98;
  undefined8 auStack_88 [9];
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar5 = 0;
  local_490[0] = local_480;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_490,"array_negative_inner_product","");
  local_550 = in_RDI;
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  if (local_490[0] != local_480) {
    operator_delete(local_490[0]);
  }
  duckdb::LogicalType::Real();
  local_4c8 = local_4c0.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_4c0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_4c0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_4d8 = (LogicalType *)(local_280 + 0x90);
    local_520 = (LogicalType *)(local_470 + 0x90);
    local_548 = &local_1d0;
    local_4e8 = auStack_1b0;
    local_530 = local_3a0;
    local_4d0 = (LogicalType *)(local_158 + 0x90);
    local_540 = &_Stack_a8;
    local_4e0 = auStack_88;
    local_528 = duckdb::Value::DECIMAL;
    local_538 = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                (local_550 + 0x20);
    oVar3.index = (idx_t)local_4c0.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    do {
      duckdb::LogicalType::ARRAY(local_348,oVar3);
      if (*(char *)oVar3.index == '\x17') {
        duckdb::LogicalType::LogicalType((LogicalType *)local_330,local_348);
        duckdb::LogicalType::LogicalType((LogicalType *)(local_330 + 0x18),local_348);
        __l_00._M_len = 2;
        __l_00._M_array = (LogicalType *)local_330;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_500,__l_00,&local_579);
        duckdb::LogicalType::LogicalType(local_518,(LogicalType *)oVar3.index);
        uStack_570 = 0;
        local_578 = ArrayGenericFold<double,duckdb::NegativeInnerProductOp>;
        pcStack_560 = std::
                      _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                      ::_M_invoke;
        local_568 = std::
                    _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                    ::_M_manager;
        duckdb::LogicalType::LogicalType(local_4a8,INVALID);
        duckdb::ScalarFunction::ScalarFunction
                  ((ScalarFunction *)local_470,&local_500,local_518,&local_578,
                   ArrayGenericBinaryBind,0,0,0,local_4a8,0,0,0);
        duckdb::LogicalType::~LogicalType(local_4a8);
        if (local_568 != (code *)0x0) {
          (*local_568)(&local_578,&local_578,3);
        }
        duckdb::LogicalType::~LogicalType(local_518);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_500);
        lVar4 = 0x18;
        do {
          duckdb::LogicalType::~LogicalType((LogicalType *)(local_330 + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        BaseScalarFunction::SetReturnsError
                  ((BaseScalarFunction *)local_330,(BaseScalarFunction *)local_470);
        duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_330);
        SimpleFunction::SimpleFunction((SimpleFunction *)local_280,(SimpleFunction *)local_470);
        local_280._0_8_ = local_528;
        duckdb::LogicalType::LogicalType(local_4d8,local_520);
        local_280._168_4_ = local_470._168_4_;
        local_280._0_8_ = &PTR__ScalarFunction_008984e0;
        std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)local_548,
                 (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)&local_3c0);
        puVar1 = local_530;
        puVar2 = local_4e8;
        for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar2 = *puVar1;
          puVar1 = puVar1 + (ulong)bVar5 * -2 + 1;
          puVar2 = puVar2 + (ulong)bVar5 * -2 + 1;
        }
        local_168 = local_358;
        local_160._M_pi = local_350._M_pi;
        if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
          }
        }
        std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>(local_538,(ScalarFunction *)local_280);
        local_280._0_8_ = &PTR__ScalarFunction_008984e0;
        if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
        }
        if (local_1c0 != (_Manager_type)0x0) {
          (*local_1c0)(local_548,local_548,__destroy_functor);
        }
        duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_280);
        local_470._0_8_ = &PTR__ScalarFunction_008984e0;
        if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350._M_pi);
        }
        if (local_3b0 != (_Manager_type)0x0) {
          (*local_3b0)(&local_3c0,&local_3c0,__destroy_functor);
        }
      }
      else {
        if (*(char *)oVar3.index != '\x16') {
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_470._0_8_ = local_470 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_470,"Array function not implemented for type %s","");
          duckdb::LogicalType::ToString_abi_cxx11_();
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this,(string *)local_470,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330)
          ;
          __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
        }
        duckdb::LogicalType::LogicalType((LogicalType *)local_330,local_348);
        duckdb::LogicalType::LogicalType((LogicalType *)(local_330 + 0x18),local_348);
        __l._M_len = 2;
        __l._M_array = (LogicalType *)local_330;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_500,__l,&local_579);
        duckdb::LogicalType::LogicalType(local_518,(LogicalType *)oVar3.index);
        uStack_570 = 0;
        local_578 = ArrayGenericFold<float,duckdb::NegativeInnerProductOp>;
        pcStack_560 = std::
                      _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                      ::_M_invoke;
        local_568 = std::
                    _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                    ::_M_manager;
        duckdb::LogicalType::LogicalType(local_4a8,INVALID);
        duckdb::ScalarFunction::ScalarFunction
                  ((ScalarFunction *)local_470,&local_500,local_518,&local_578,
                   ArrayGenericBinaryBind,0,0,0,local_4a8,0,0,0);
        duckdb::LogicalType::~LogicalType(local_4a8);
        if (local_568 != (code *)0x0) {
          (*local_568)(&local_578,&local_578,3);
        }
        duckdb::LogicalType::~LogicalType(local_518);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_500);
        lVar4 = 0x18;
        do {
          duckdb::LogicalType::~LogicalType((LogicalType *)(local_330 + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        BaseScalarFunction::SetReturnsError
                  ((BaseScalarFunction *)local_330,(BaseScalarFunction *)local_470);
        duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_330);
        SimpleFunction::SimpleFunction((SimpleFunction *)local_158,(SimpleFunction *)local_470);
        local_158._0_8_ = local_528;
        duckdb::LogicalType::LogicalType(local_4d0,local_520);
        local_158._168_4_ = local_470._168_4_;
        local_158._0_8_ = &PTR__ScalarFunction_008984e0;
        std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)local_540,
                 (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)&local_3c0);
        puVar1 = local_530;
        puVar2 = local_4e0;
        for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar2 = *puVar1;
          puVar1 = puVar1 + (ulong)bVar5 * -2 + 1;
          puVar2 = puVar2 + (ulong)bVar5 * -2 + 1;
        }
        local_40 = local_358;
        local_38._M_pi = local_350._M_pi;
        if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
          }
        }
        std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>(local_538,(ScalarFunction *)local_158);
        local_158._0_8_ = &PTR__ScalarFunction_008984e0;
        if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
        }
        if (local_98 != (_Manager_type)0x0) {
          (*local_98)(local_540,local_540,__destroy_functor);
        }
        duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_158);
        local_470._0_8_ = &PTR__ScalarFunction_008984e0;
        if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350._M_pi);
        }
        if (local_3b0 != (_Manager_type)0x0) {
          (*local_3b0)(&local_3c0,&local_3c0,__destroy_functor);
        }
      }
      duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_470);
      duckdb::LogicalType::~LogicalType(local_348);
      oVar3.index = oVar3.index + 0x18;
    } while ((pointer)oVar3.index != local_4c8);
  }
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_4c0);
  return local_550;
}

Assistant:

ScalarFunctionSet ArrayNegativeInnerProductFun::GetFunctions() {
	ScalarFunctionSet set("array_negative_inner_product");
	for (auto &type : LogicalType::Real()) {
		AddArrayFoldFunction<NegativeInnerProductOp>(set, type);
	}
	return set;
}